

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O2

char ** p2sc_readlines_file(char *name,int strip)

{
  p2sc_iofile_t *f;
  undefined8 uVar1;
  undefined8 uVar2;
  char **ppcVar3;
  char *line;
  
  f = p2sc_open_iofile(name,"r");
  uVar1 = g_array_new(1,0,8);
  do {
    while( true ) {
      line = p2sc_read_line(f);
      if (line == (char *)0x0) {
        p2sc_free_iofile(f);
        ppcVar3 = (char **)g_array_free(uVar1,0);
        return ppcVar3;
      }
      if (strip != 0) break;
LAB_0010b782:
      g_array_append_vals(uVar1,&line,1);
    }
    uVar2 = g_strchug(line);
    line = (char *)g_strchomp(uVar2);
    if (*line != '\0') goto LAB_0010b782;
    g_free(line);
  } while( true );
}

Assistant:

char **p2sc_readlines_file(const char *name, int strip) {
    char *line;
    p2sc_iofile_t *f = p2sc_open_iofile(name, "r");
    GArray *a = g_array_new(TRUE, FALSE, sizeof(char *));

    while ((line = p2sc_read_line(f))) {
        if (strip) {
            line = g_strstrip(line);
            if (!*line) {
                g_free(line);
                continue;
            }
        }
        g_array_append_val(a, line);
    }

    p2sc_free_iofile(f);

    return (char **) g_array_free(a, FALSE);
}